

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcemanager.cpp
# Opt level: O2

void __thiscall
ResourceManager::addShader(ResourceManager *this,GLuint program,string *vtShader,string *fragShader)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  GLuint local_2c [2];
  GLuint program_local;
  
  local_2c[0] = program;
  std::operator+(&local_70,vtShader,",");
  std::operator+(&local_50,&local_70,fragShader);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
  ::_M_emplace_unique<std::__cxx11::string,unsigned_int&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
              *)&this->loadedShaders,&local_50,local_2c);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void ResourceManager::addShader(GLuint program, std::string vtShader, std::string fragShader)
{
	loadedShaders.emplace((vtShader + "," + fragShader), program);
}